

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_int_distribution.hpp
# Opt level: O1

unsigned_long
boost::random::detail::
generate_uniform_int<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>,unsigned_long>
          (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
           *eng,unsigned_long min_value,long max_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  range_type limit;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long local_38;
  
  uVar10 = max_value - min_value;
  uVar8 = min_value;
  if (uVar10 != 0) {
    if (uVar10 == 0xffffffff) {
      if (eng->i == 0x270) {
        mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
        ::twist(eng);
      }
      uVar4 = eng->x[eng->i];
      eng->i = eng->i + 1;
      uVar4 = uVar4 >> 0xb ^ uVar4;
      uVar4 = (uVar4 & 0x13a58ad) << 7 ^ uVar4;
      uVar4 = (uVar4 & 0x1df8c) << 0xf ^ uVar4;
      uVar8 = (uVar4 >> 0x12 ^ uVar4) + min_value;
    }
    else if (uVar10 >> 0x20 == 0) {
      uVar4 = (uint)uVar10;
      do {
        if (eng->i == 0x270) {
          mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
          ::twist(eng);
        }
        uVar5 = eng->x[eng->i];
        eng->i = eng->i + 1;
        uVar5 = uVar5 >> 0xb ^ uVar5;
        uVar5 = (uVar5 & 0x13a58ad) << 7 ^ uVar5;
        uVar5 = (uVar5 & 0x1df8c) << 0xf ^ uVar5;
        uVar10 = (ulong)(uVar5 >> 0x12 ^ uVar5) /
                 (ulong)((uint)((uint)(0xffffffff % (ulong)(uVar4 + 1)) == uVar4) +
                        (int)(0xffffffff / (ulong)(uVar4 + 1)));
        uVar8 = min_value + uVar10;
      } while (uVar4 < (uint)uVar10);
    }
    else {
      uVar9 = 0x100000000;
      if (uVar10 != 0xffffffffffffffff) {
        uVar9 = uVar10 + 1 >> 0x20;
      }
      do {
        uVar12 = 1;
        uVar11 = 0;
        if (uVar9 != 0) {
          do {
            if (eng->i == 0x270) {
              mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              ::twist(eng);
            }
            uVar4 = eng->x[eng->i];
            eng->i = eng->i + 1;
            uVar4 = uVar4 >> 0xb ^ uVar4;
            uVar4 = (uVar4 & 0x13a58ad) << 7 ^ uVar4;
            uVar4 = (uVar4 & 0x1df8c) << 0xf ^ uVar4;
            uVar11 = uVar11 + (uVar4 >> 0x12 ^ uVar4) * uVar12;
            if (uVar12 * 0x100000000 == uVar10 + 1) {
              bVar3 = false;
              uVar8 = uVar11;
              goto LAB_0011a111;
            }
            uVar12 = uVar12 << 0x20;
          } while (uVar12 <= uVar9);
        }
        uVar6 = generate_uniform_int<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>,unsigned_long>
                          (eng,0,uVar10 / uVar12);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar12;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar6;
        bVar3 = true;
        uVar8 = local_38;
        if (SUB168(auVar1 * auVar2,8) == 0) {
          uVar12 = uVar6 * uVar12;
          uVar7 = uVar12 + uVar11;
          bVar3 = uVar10 < uVar7 || CARRY8(uVar12,uVar11);
          uVar8 = uVar7 + min_value;
          if (uVar10 < uVar7 || CARRY8(uVar12,uVar11)) {
            uVar8 = local_38;
          }
        }
LAB_0011a111:
        local_38 = uVar8;
      } while (bVar3);
    }
  }
  return uVar8;
}

Assistant:

T generate_uniform_int(
    Engine& eng, T min_value, T max_value,
    boost::mpl::true_ /** is_integral<Engine::result_type> */)
{
    typedef T result_type;
    typedef typename boost::random::traits::make_unsigned_or_unbounded<T>::type range_type;
    typedef typename Engine::result_type base_result;
    // ranges are always unsigned or unbounded
    typedef typename boost::random::traits::make_unsigned_or_unbounded<base_result>::type base_unsigned;
    const range_type range = random::detail::subtract<result_type>()(max_value, min_value);
    const base_result bmin = (eng.min)();
    const base_unsigned brange =
      random::detail::subtract<base_result>()((eng.max)(), (eng.min)());

    if(range == 0) {
      return min_value;    
    } else if(brange == range) {
      // this will probably never happen in real life
      // basically nothing to do; just take care we don't overflow / underflow
      base_unsigned v = random::detail::subtract<base_result>()(eng(), bmin);
      return random::detail::add<base_unsigned, result_type>()(v, min_value);
    } else if(brange < range) {
      // use rejection method to handle things like 0..3 --> 0..4
      for(;;) {
        // concatenate several invocations of the base RNG
        // take extra care to avoid overflows

        //  limit == floor((range+1)/(brange+1))
        //  Therefore limit*(brange+1) <= range+1
        range_type limit;
        if(range == (std::numeric_limits<range_type>::max)()) {
          limit = range/(range_type(brange)+1);
          if(range % (range_type(brange)+1) == range_type(brange))
            ++limit;
        } else {
          limit = (range+1)/(range_type(brange)+1);
        }

        // We consider "result" as expressed to base (brange+1):
        // For every power of (brange+1), we determine a random factor
        range_type result = range_type(0);
        range_type mult = range_type(1);

        // loop invariants:
        //  result < mult
        //  mult <= range
        while(mult <= limit) {
          // Postcondition: result <= range, thus no overflow
          //
          // limit*(brange+1)<=range+1                   def. of limit       (1)
          // eng()-bmin<=brange                          eng() post.         (2)
          // and mult<=limit.                            loop condition      (3)
          // Therefore mult*(eng()-bmin+1)<=range+1      by (1),(2),(3)      (4)
          // Therefore mult*(eng()-bmin)+mult<=range+1   rearranging (4)     (5)
          // result<mult                                 loop invariant      (6)
          // Therefore result+mult*(eng()-bmin)<range+1  by (5), (6)         (7)
          //
          // Postcondition: result < mult*(brange+1)
          //
          // result<mult                                 loop invariant      (1)
          // eng()-bmin<=brange                          eng() post.         (2)
          // Therefore result+mult*(eng()-bmin) <
          //           mult+mult*(eng()-bmin)            by (1)              (3)
          // Therefore result+(eng()-bmin)*mult <
          //           mult+mult*brange                  by (2), (3)         (4)
          // Therefore result+(eng()-bmin)*mult <
          //           mult*(brange+1)                   by (4)
          result += static_cast<range_type>(static_cast<range_type>(random::detail::subtract<base_result>()(eng(), bmin)) * mult);

          // equivalent to (mult * (brange+1)) == range+1, but avoids overflow.
          if(mult * range_type(brange) == range - mult + 1) {
              // The destination range is an integer power of
              // the generator's range.
              return(result);
          }

          // Postcondition: mult <= range
          // 
          // limit*(brange+1)<=range+1                   def. of limit       (1)
          // mult<=limit                                 loop condition      (2)
          // Therefore mult*(brange+1)<=range+1          by (1), (2)         (3)
          // mult*(brange+1)!=range+1                    preceding if        (4)
          // Therefore mult*(brange+1)<range+1           by (3), (4)         (5)
          // 
          // Postcondition: result < mult
          //
          // See the second postcondition on the change to result. 
          mult *= range_type(brange)+range_type(1);
        }
        // loop postcondition: range/mult < brange+1
        //
        // mult > limit                                  loop condition      (1)
        // Suppose range/mult >= brange+1                Assumption          (2)
        // range >= mult*(brange+1)                      by (2)              (3)
        // range+1 > mult*(brange+1)                     by (3)              (4)
        // range+1 > (limit+1)*(brange+1)                by (1), (4)         (5)
        // (range+1)/(brange+1) > limit+1                by (5)              (6)
        // limit < floor((range+1)/(brange+1))           by (6)              (7)
        // limit==floor((range+1)/(brange+1))            def. of limit       (8)
        // not (2)                                       reductio            (9)
        //
        // loop postcondition: (range/mult)*mult+(mult-1) >= range
        //
        // (range/mult)*mult + range%mult == range       identity            (1)
        // range%mult < mult                             def. of %           (2)
        // (range/mult)*mult+mult > range                by (1), (2)         (3)
        // (range/mult)*mult+(mult-1) >= range           by (3)              (4)
        //
        // Note that the maximum value of result at this point is (mult-1),
        // so after this final step, we generate numbers that can be
        // at least as large as range.  We have to really careful to avoid
        // overflow in this final addition and in the rejection.  Anything
        // that overflows is larger than range and can thus be rejected.

        // range/mult < brange+1  -> no endless loop
        range_type result_increment =
            generate_uniform_int(
                eng,
                static_cast<range_type>(0),
                static_cast<range_type>(range/mult),
                boost::mpl::true_());
        if(std::numeric_limits<range_type>::is_bounded && ((std::numeric_limits<range_type>::max)() / mult < result_increment)) {
          // The multiplcation would overflow.  Reject immediately.
          continue;
        }
        result_increment *= mult;
        // unsigned integers are guaranteed to wrap on overflow.
        result += result_increment;
        if(result < result_increment) {
          // The addition overflowed.  Reject.
          continue;
        }
        if(result > range) {
          // Too big.  Reject.
          continue;
        }
        return random::detail::add<range_type, result_type>()(result, min_value);
      }
    } else {                   // brange > range
#ifdef BOOST_NO_CXX11_EXPLICIT_CONVERSION_OPERATORS
      typedef typename mpl::if_c<
         std::numeric_limits<range_type>::is_specialized && std::numeric_limits<base_unsigned>::is_specialized
         && (std::numeric_limits<range_type>::digits >= std::numeric_limits<base_unsigned>::digits),
         range_type, base_unsigned>::type mixed_range_type;
#else
      typedef base_unsigned mixed_range_type;
#endif

      mixed_range_type bucket_size;
      // it's safe to add 1 to range, as long as we cast it first,
      // because we know that it is less than brange.  However,
      // we do need to be careful not to cause overflow by adding 1
      // to brange.  We use mixed_range_type throughout for mixed
      // arithmetic between base_unsigned and range_type - in the case
      // that range_type has more bits than base_unsigned it is always
      // safe to use range_type for this albeit it may be more effient
      // to use base_unsigned.  The latter is a narrowing conversion though
      // which may be disallowed if range_type is a multiprecision type
      // and there are no explicit converison operators.

      if(brange == (std::numeric_limits<base_unsigned>::max)()) {
        bucket_size = static_cast<mixed_range_type>(brange) / (static_cast<mixed_range_type>(range)+1);
        if(static_cast<mixed_range_type>(brange) % (static_cast<mixed_range_type>(range)+1) == static_cast<mixed_range_type>(range)) {
          ++bucket_size;
        }
      } else {
        bucket_size = static_cast<mixed_range_type>(brange + 1) / (static_cast<mixed_range_type>(range)+1);
      }
      for(;;) {
        mixed_range_type result =
          random::detail::subtract<base_result>()(eng(), bmin);
        result /= bucket_size;
        // result and range are non-negative, and result is possibly larger
        // than range, so the cast is safe
        if(result <= static_cast<mixed_range_type>(range))
          return random::detail::add<mixed_range_type, result_type>()(result, min_value);
      }
    }
}